

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbdif.cpp
# Opt level: O1

char * ask_user_name(char *szPrompt,char *szDefault)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *__s;
  size_t sVar4;
  char *pcVar5;
  
  pcVar3 = ask_user_string(szPrompt,szDefault);
  pcVar5 = pcVar3;
  do {
    __s = pcVar5;
    cVar1 = *__s;
    iVar2 = isspace((int)cVar1);
    if ((iVar2 == 0) || (cVar1 == '\n')) break;
    pcVar5 = __s + 1;
  } while (cVar1 != '\0');
  cVar1 = *__s;
  iVar2 = isspace((int)cVar1);
  pcVar5 = __s;
  while (((iVar2 == 0 && (cVar1 != '\0')) && (cVar1 != '\n'))) {
    cVar1 = pcVar5[1];
    pcVar5 = pcVar5 + 1;
    iVar2 = isspace((int)cVar1);
  }
  *pcVar5 = '\0';
  sVar4 = strlen(__s);
  pcVar5 = (char *)operator_new__(sVar4 + 1);
  strcpy(pcVar5,__s);
  operator_delete(pcVar3,1);
  return pcVar5;
}

Assistant:

char*
ask_user_name (const char* szPrompt, const char* szDefault)
{
  char	*szResult = ask_user_string(szPrompt, szDefault);
  char	*s1, *s2, *szNewResult;

  // strip spaces
  s1 = szResult;
  while(isspace(*s1) && '\0' != *s1 && '\n' != *s1)
    ++s1;

  s2 = s1;
  while(!isspace(*s2) && '\0' != *s2 && '\n' != *s2)
    ++s2;
  *s2 = '\0';

  szNewResult = new char[strlen(s1) + 1];
  strcpy(szNewResult, s1);

  delete szResult;

  return szNewResult;
}